

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2melody.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *filename;
  void *this;
  undefined1 local_100 [8];
  vector<Melody,_std::allocator<Melody>_> melody;
  string local_e0 [32];
  undefined4 local_c0;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  MidiFile midifile;
  char **argv_local;
  int argc_local;
  
  midifile._104_8_ = argv;
  checkOptions(&options,argc,argv);
  filename = smf::Options::getArg_abi_cxx11_(&options,1);
  smf::MidiFile::MidiFile((MidiFile *)local_88,filename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"track-count",&local_a9);
  bVar1 = smf::Options::getBoolean(&options,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (bVar1) {
    iVar2 = smf::MidiFile::getTrackCount((MidiFile *)local_88);
    this = (void *)std::ostream::operator<<(&std::cout,iVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_c0 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,"track",
               (allocator *)
               ((long)&melody.super__Vector_base<Melody,_std::allocator<Melody>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = smf::Options::getBoolean(&options,(string *)local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&melody.super__Vector_base<Melody,_std::allocator<Melody>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      smf::MidiFile::joinTracks((MidiFile *)local_88);
    }
    std::vector<Melody,_std::allocator<Melody>_>::vector
              ((vector<Melody,_std::allocator<Melody>_> *)local_100);
    convertToMelody((MidiFile *)local_88,(vector<Melody,_std::allocator<Melody>_> *)local_100);
    sortMelody((vector<Melody,_std::allocator<Melody>_> *)local_100);
    iVar2 = smf::MidiFile::getTicksPerQuarterNote((MidiFile *)local_88);
    printMelody((vector<Melody,_std::allocator<Melody>_> *)local_100,iVar2);
    local_c0 = 1;
    std::vector<Melody,_std::allocator<Melody>_>::~vector
              ((vector<Melody,_std::allocator<Melody>_> *)local_100);
  }
  smf::MidiFile::~MidiFile((MidiFile *)local_88);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   checkOptions(options, argc, argv);
   MidiFile midifile(options.getArg(1));
   if (options.getBoolean("track-count")) {
      cout << midifile.getTrackCount() << endl;
      return 0;
   }
   if (!options.getBoolean("track")) {
      midifile.joinTracks();
   } 

   vector<Melody> melody;
   convertToMelody(midifile, melody);
   sortMelody(melody);
   printMelody(melody, midifile.getTicksPerQuarterNote());

   return 0;
}